

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodOptions::SharedCtor(MethodOptions *this)

{
  this->_cached_size_ = 0;
  this->deprecated_ = false;
  *(undefined3 *)&this->field_0x69 = 0;
  this->idempotency_level_ = 0;
  return;
}

Assistant:

void MethodOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&deprecated_, 0, reinterpret_cast<char*>(&idempotency_level_) -
    reinterpret_cast<char*>(&deprecated_) + sizeof(idempotency_level_));
}